

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binaryfusefilter.h
# Opt level: O2

uint64_t binary_fuse_murmur64(uint64_t h)

{
  ulong uVar1;
  
  uVar1 = (h >> 0x21 ^ h) * -0xae502812aa7333;
  uVar1 = (uVar1 >> 0x21 ^ uVar1) * -0x3b314601e57a13ad;
  return uVar1 >> 0x21 ^ uVar1;
}

Assistant:

static inline uint64_t binary_fuse_murmur64(uint64_t h) {
  h ^= h >> 33U;
  h *= UINT64_C(0xff51afd7ed558ccd);
  h ^= h >> 33U;
  h *= UINT64_C(0xc4ceb9fe1a85ec53);
  h ^= h >> 33U;
  return h;
}